

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_compute_blob.h
# Opt level: O2

void ncnn::gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  compute_coord<(ncnn::GridSample::PaddingMode)3,_false> get_coord;
  
  iVar7 = grid->h * grid->w;
  piVar9 = (int *)offset_value->data;
  if (permute_fusion == 0) {
    for (lVar12 = 0; lVar12 < grid->c; lVar12 = lVar12 + 1) {
      lVar11 = grid->cstep * grid->elemsize * lVar12;
      pvVar1 = grid->data;
      for (lVar8 = 0; (int)lVar8 < iVar7; lVar8 = lVar8 + 2) {
        fVar14 = *(float *)((long)pvVar1 + lVar8 * 4 + lVar11 + 4);
        fVar13 = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                           (&get_coord,src->w,
                            (*(float *)((long)pvVar1 + lVar8 * 4 + lVar11) * 0.5 + 0.5) *
                            (float)src->w + -0.5);
        fVar14 = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                           (&get_coord,src->h,(fVar14 * 0.5 + 0.5) * (float)src->h + -0.5);
        fVar13 = floorf(fVar13 + 0.5);
        uVar10 = (uint)fVar13;
        fVar14 = floorf(fVar14 + 0.5);
        uVar4 = (uint)fVar14;
        iVar5 = -1;
        iVar6 = (src->w * uVar4 + uVar10) * src->elempack;
        if ((int)(uVar4 | uVar10) < 0) {
          iVar6 = iVar5;
        }
        if (src->w <= (int)uVar10) {
          iVar6 = iVar5;
        }
        if (src->h <= (int)uVar4) {
          iVar6 = iVar5;
        }
        *piVar9 = iVar6;
        piVar9 = piVar9 + 1;
      }
    }
  }
  else {
    pvVar1 = grid->data;
    sVar2 = grid->elemsize;
    sVar3 = grid->cstep;
    lVar12 = 0;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    for (; iVar7 != (int)lVar12; lVar12 = lVar12 + 1) {
      fVar14 = *(float *)((long)pvVar1 + lVar12 * 4 + sVar2 * sVar3);
      fVar13 = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                         (&get_coord,src->w,
                          (*(float *)((long)pvVar1 + lVar12 * 4) * 0.5 + 0.5) * (float)src->w + -0.5
                         );
      fVar14 = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                         (&get_coord,src->h,(fVar14 * 0.5 + 0.5) * (float)src->h + -0.5);
      fVar13 = floorf(fVar13 + 0.5);
      uVar10 = (uint)fVar13;
      fVar14 = floorf(fVar14 + 0.5);
      uVar4 = (uint)fVar14;
      iVar5 = -1;
      iVar6 = (src->w * uVar4 + uVar10) * src->elempack;
      if ((int)(uVar4 | uVar10) < 0) {
        iVar6 = iVar5;
      }
      if (src->w <= (int)uVar10) {
        iVar6 = iVar5;
      }
      if (src->h <= (int)uVar4) {
        iVar6 = iVar5;
      }
      piVar9[lVar12] = iVar6;
    }
  }
  return;
}

Assistant:

void gridsample_2d_nearest_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h;

    float* offset_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 15 < grid_size; x += 16)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);

                transpose2x8_ps(gx, gy);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
                gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));

                __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                                  _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));

                __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx), _mm256_set1_ps(src.elempack));

                offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

                _mm256_storeu_ps(offset_ptr, offset);

                gridptr += 16;
                offset_ptr += 8;
            }

#endif // __AVX__

            for (; x < grid_size; x += 2)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                int x0 = static_cast<int>(floorf(sample_x + 0.5f));
                int y0 = static_cast<int>(floorf(sample_y + 0.5f));

                bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h));

                int* iptr = (int*)offset_ptr;
                *iptr = in_bound ? (x0 + y0 * src.w) * src.elempack : -1.0;

                gridptr += 2;
                offset_ptr++;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
            gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));

            __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                              _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));

            __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx), _mm256_set1_ps(src.elempack));

            offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

            _mm256_storeu_ps(offset_ptr, offset);

            gridptr_x += 8;
            gridptr_y += 8;
            offset_ptr += 8;
        }

#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            int x0 = static_cast<int>(floorf(sample_x + 0.5f));
            int y0 = static_cast<int>(floorf(sample_y + 0.5f));

            bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h));

            int* iptr = (int*)offset_ptr;
            *iptr = in_bound ? (x0 + y0 * src.w) * src.elempack : -1.0;

            gridptr_x++;
            gridptr_y++;

            offset_ptr++;
        }
    }
}